

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzer.cpp
# Opt level: O1

U64 __thiscall USBAnalyzer::SendPacketToHandler(USBAnalyzer *this,USBPacket *pckt)

{
  USB_PID UVar1;
  U64 UVar2;
  iterator iVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>,_bool>
  pVar4;
  USBControlTransferPacketHandler UStack_1f8;
  pair<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler> local_118;
  
  UVar1 = pckt->mPID;
  if (((UVar1 == PID_SETUP) || (UVar1 == PID_OUT)) || (UVar1 == PID_IN)) {
    (this->mCtrlTransLastPipe).addr =
         (pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[2] & 0x7f;
    (this->mCtrlTransLastPipe).endp =
         *(ushort *)
          ((pckt->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + -2) >> 7 & 0xf;
  }
  if ((((this->mCtrlTransLastPipe).endp == 0) && (UVar1 != PID_PRE)) && (UVar1 != PID_SOF)) {
    iVar3 = std::
            _Rb_tree<USBAnalyzer::USBPipe,_std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>,_std::_Select1st<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>,_std::less<USBAnalyzer::USBPipe>,_std::allocator<std::pair<const_USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>_>_>
            ::find(&(this->mCtrlTransPacketHandlers)._M_t,&this->mCtrlTransLastPipe);
    if ((_Rb_tree_header *)iVar3._M_node ==
        &(this->mCtrlTransPacketHandlers)._M_t._M_impl.super__Rb_tree_header) {
      memset(&UStack_1f8,0,0xe0);
      USBControlTransferParser::USBControlTransferParser(&UStack_1f8.mCtrlTransParser);
      std::pair<USBAnalyzer::USBPipe,_USBControlTransferPacketHandler>::
      pair<USBAnalyzer::USBPipe_&,_USBControlTransferPacketHandler,_true>
                (&local_118,&this->mCtrlTransLastPipe,&UStack_1f8);
      pVar4 = std::
              _Rb_tree<USBAnalyzer::USBPipe,std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>,std::_Select1st<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>,std::less<USBAnalyzer::USBPipe>,std::allocator<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>>
              ::_M_emplace_unique<std::pair<USBAnalyzer::USBPipe,USBControlTransferPacketHandler>>
                        ((_Rb_tree<USBAnalyzer::USBPipe,std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>,std::_Select1st<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>,std::less<USBAnalyzer::USBPipe>,std::allocator<std::pair<USBAnalyzer::USBPipe_const,USBControlTransferPacketHandler>>>
                          *)&this->mCtrlTransPacketHandlers,&local_118);
      iVar3._M_node = (_Base_ptr)pVar4.first._M_node;
      if (local_118.second.mCtrlTransParser.mHidUsagePageStack.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.second.mCtrlTransParser.mHidUsagePageStack.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_USBClassCodes>,_std::_Select1st<std::pair<const_unsigned_char,_USBClassCodes>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
      ::~_Rb_tree(&local_118.second.mCtrlTransParser.mInterfaceClasses._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_118.second.mCtrlTransParser.utf16StringDescriptor._M_dataplus._M_p !=
          &local_118.second.mCtrlTransParser.utf16StringDescriptor.field_2) {
        operator_delete(local_118.second.mCtrlTransParser.utf16StringDescriptor._M_dataplus._M_p);
      }
      if (UStack_1f8.mCtrlTransParser.mHidUsagePageStack.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(UStack_1f8.mCtrlTransParser.mHidUsagePageStack.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_char,_std::pair<const_unsigned_char,_USBClassCodes>,_std::_Select1st<std::pair<const_unsigned_char,_USBClassCodes>_>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_USBClassCodes>_>_>
      ::~_Rb_tree(&UStack_1f8.mCtrlTransParser.mInterfaceClasses._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)UStack_1f8.mCtrlTransParser.utf16StringDescriptor._M_dataplus._M_p !=
          &UStack_1f8.mCtrlTransParser.utf16StringDescriptor.field_2) {
        operator_delete(UStack_1f8.mCtrlTransParser.utf16StringDescriptor._M_dataplus._M_p);
      }
      USBControlTransferPacketHandler::Init
                ((USBControlTransferPacketHandler *)&iVar3._M_node[1]._M_parent,
                 (this->mResults)._M_ptr,(this->mCtrlTransLastPipe).addr);
    }
    UVar2 = USBControlTransferPacketHandler::HandleControlTransfer
                      ((USBControlTransferPacketHandler *)&iVar3._M_node[1]._M_parent,pckt);
    return UVar2;
  }
  UVar2 = USBPacket::AddPacketFrames(pckt,(this->mResults)._M_ptr,FF_None);
  return UVar2;
}

Assistant:

U64 USBAnalyzer::SendPacketToHandler( USBPacket& pckt )
{
    if( pckt.IsTokenPacket() )
    {
        mCtrlTransLastPipe.addr = pckt.GetAddress();
        mCtrlTransLastPipe.endp = pckt.GetEndpoint();
    }

    // only control transfers and no SOF or PRE packets
    if( mCtrlTransLastPipe.endp == 0 && pckt.mPID != PID_SOF && pckt.mPID != PID_PRE )
    {
        // do we have this address/enpoint already?
        USBPipeHandler::iterator srch( mCtrlTransPacketHandlers.find( mCtrlTransLastPipe ) );

        // is this a new address?
        if( srch == mCtrlTransPacketHandlers.end() )
        {
            srch = mCtrlTransPacketHandlers.insert( std::make_pair( mCtrlTransLastPipe, USBControlTransferPacketHandler() ) ).first;
            srch->second.Init( mResults.get(), mCtrlTransLastPipe.addr );
        }

        return srch->second.HandleControlTransfer( pckt );
    }

    return pckt.AddPacketFrames( mResults.get() );
}